

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O3

TIFFReadDirEntryErr
TIFFReadDirEntryArrayWithLimit
          (TIFF *tif,TIFFDirEntry *direntry,uint32_t *count,uint32_t desttypesize,void **value,
          uint64_t maxcount)

{
  void *dest;
  void **ppvVar1;
  TIFF *tif_00;
  uint uVar2;
  uint uVar3;
  TIFFReadDirEntryErr TVar4;
  uint uVar5;
  int iVar7;
  ulong uVar8;
  void *data;
  uint32_t offset;
  void *local_50;
  ulong local_48;
  void **local_40;
  TIFF *local_38;
  ulong uVar6;
  
  local_38 = tif;
  uVar2 = TIFFDataWidth((uint)direntry->tdir_type);
  tif_00 = local_38;
  uVar6 = direntry->tdir_count;
  if (uVar6 < maxcount) {
    maxcount = uVar6;
  }
  if (uVar2 == 0 || maxcount == 0) {
    *value = (void *)0x0;
    return TIFFReadDirEntryErrOk;
  }
  uVar8 = 10;
  if (uVar6 < 10) {
    uVar8 = uVar6;
  }
  if (0x7fffffff / (ulong)uVar2 < maxcount) {
    return TIFFReadDirEntryErrSizesan;
  }
  if (0x7fffffff / (ulong)desttypesize < maxcount) {
    return TIFFReadDirEntryErrSizesan;
  }
  *count = (uint32_t)maxcount;
  uVar5 = uVar2 * (uint32_t)maxcount;
  uVar6 = (ulong)uVar5;
  local_40 = value;
  if (uVar5 == 0) {
    __assert_fail("(tmsize_t)datasize > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirread.c"
                  ,0x51d,
                  "enum TIFFReadDirEntryErr TIFFReadDirEntryArrayWithLimit(TIFF *, TIFFDirEntry *, uint32_t *, uint32_t, void **, uint64_t)"
                 );
  }
  uVar3 = local_38->tif_flags;
  if ((uVar3 >> 0xb & 1) == 0) {
    if (((8 < uVar5 & (byte)(uVar3 >> 0x13) & 1) == 0) && (uVar5 < 5 || (uVar3 >> 0x13 & 1) != 0))
    goto LAB_00293dcc;
    local_50 = (void *)0x0;
  }
  else {
    if ((ulong)local_38->tif_size < uVar6) {
      return TIFFReadDirEntryErrIo;
    }
LAB_00293dcc:
    local_50 = _TIFFCheckMalloc(local_38,maxcount,(long)(int)uVar2,"ReadDirEntryArray");
    if (local_50 == (void *)0x0) {
      return TIFFReadDirEntryErrAlloc;
    }
    uVar3 = tif_00->tif_flags;
  }
  ppvVar1 = local_40;
  dest = local_50;
  iVar7 = uVar2 * (int)uVar8;
  if ((uVar3 >> 0x13 & 1) == 0) {
    if ((4 < iVar7) || (4 < uVar5)) {
      local_48 = CONCAT44(local_48._4_4_,(direntry->tdir_offset).toff_long);
      if ((char)uVar3 < '\0') {
        TIFFSwabLong((uint32_t *)&local_48);
        uVar3 = tif_00->tif_flags;
      }
      uVar8 = local_48 & 0xffffffff;
      if ((uVar3 >> 0xb & 1) != 0) goto LAB_00293ea1;
LAB_00293e4a:
      TVar4 = TIFFReadDirEntryDataAndRealloc(tif_00,uVar8,uVar6,&local_50);
LAB_00293eac:
      if (TVar4 != TIFFReadDirEntryErrOk) {
        _TIFFfreeExt(tif_00,local_50);
        return TVar4;
      }
      goto LAB_00293ed5;
    }
  }
  else if ((8 < iVar7) || (8 < uVar5)) {
    local_48 = (direntry->tdir_offset).toff_long8;
    if ((char)uVar3 < '\0') {
      TIFFSwabLong8(&local_48);
      uVar3 = tif_00->tif_flags;
    }
    uVar8 = local_48;
    if ((uVar3 >> 0xb & 1) == 0) goto LAB_00293e4a;
LAB_00293ea1:
    TVar4 = TIFFReadDirEntryData(tif_00,uVar8,uVar6,dest);
    goto LAB_00293eac;
  }
  _TIFFmemcpy(local_50,&direntry->tdir_offset,uVar6);
  local_40 = ppvVar1;
LAB_00293ed5:
  *local_40 = local_50;
  return TIFFReadDirEntryErrOk;
}

Assistant:

static enum TIFFReadDirEntryErr
TIFFReadDirEntryArrayWithLimit(TIFF *tif, TIFFDirEntry *direntry,
                               uint32_t *count, uint32_t desttypesize,
                               void **value, uint64_t maxcount)
{
    int typesize;
    uint32_t datasize;
    void *data;
    uint64_t target_count64;
    int original_datasize_clamped;
    typesize = TIFFDataWidth(direntry->tdir_type);

    target_count64 =
        (direntry->tdir_count > maxcount) ? maxcount : direntry->tdir_count;

    if ((target_count64 == 0) || (typesize == 0))
    {
        *value = 0;
        return (TIFFReadDirEntryErrOk);
    }
    (void)desttypesize;

    /* We just want to know if the original tag size is more than 4 bytes
     * (classic TIFF) or 8 bytes (BigTIFF)
     */
    original_datasize_clamped =
        ((direntry->tdir_count > 10) ? 10 : (int)direntry->tdir_count) *
        typesize;

    /*
     * As a sanity check, make sure we have no more than a 2GB tag array
     * in either the current data type or the dest data type.  This also
     * avoids problems with overflow of tmsize_t on 32bit systems.
     */
    if ((uint64_t)(MAX_SIZE_TAG_DATA / typesize) < target_count64)
        return (TIFFReadDirEntryErrSizesan);
    if ((uint64_t)(MAX_SIZE_TAG_DATA / desttypesize) < target_count64)
        return (TIFFReadDirEntryErrSizesan);

    *count = (uint32_t)target_count64;
    datasize = (*count) * typesize;
    assert((tmsize_t)datasize > 0);

    if (isMapped(tif) && datasize > (uint64_t)tif->tif_size)
        return TIFFReadDirEntryErrIo;

    if (!isMapped(tif) && (((tif->tif_flags & TIFF_BIGTIFF) && datasize > 8) ||
                           (!(tif->tif_flags & TIFF_BIGTIFF) && datasize > 4)))
    {
        data = NULL;
    }
    else
    {
        data = _TIFFCheckMalloc(tif, *count, typesize, "ReadDirEntryArray");
        if (data == 0)
            return (TIFFReadDirEntryErrAlloc);
    }
    if (!(tif->tif_flags & TIFF_BIGTIFF))
    {
        /* Only the condition on original_datasize_clamped. The second
         * one is implied, but Coverity Scan cannot see it. */
        if (original_datasize_clamped <= 4 && datasize <= 4)
            _TIFFmemcpy(data, &direntry->tdir_offset, datasize);
        else
        {
            enum TIFFReadDirEntryErr err;
            uint32_t offset = direntry->tdir_offset.toff_long;
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong(&offset);
            if (isMapped(tif))
                err = TIFFReadDirEntryData(tif, (uint64_t)offset,
                                           (tmsize_t)datasize, data);
            else
                err = TIFFReadDirEntryDataAndRealloc(tif, (uint64_t)offset,
                                                     (tmsize_t)datasize, &data);
            if (err != TIFFReadDirEntryErrOk)
            {
                _TIFFfreeExt(tif, data);
                return (err);
            }
        }
    }
    else
    {
        /* See above comment for the Classic TIFF case */
        if (original_datasize_clamped <= 8 && datasize <= 8)
            _TIFFmemcpy(data, &direntry->tdir_offset, datasize);
        else
        {
            enum TIFFReadDirEntryErr err;
            uint64_t offset = direntry->tdir_offset.toff_long8;
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabLong8(&offset);
            if (isMapped(tif))
                err = TIFFReadDirEntryData(tif, (uint64_t)offset,
                                           (tmsize_t)datasize, data);
            else
                err = TIFFReadDirEntryDataAndRealloc(tif, (uint64_t)offset,
                                                     (tmsize_t)datasize, &data);
            if (err != TIFFReadDirEntryErrOk)
            {
                _TIFFfreeExt(tif, data);
                return (err);
            }
        }
    }
    *value = data;
    return (TIFFReadDirEntryErrOk);
}